

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_impl.h
# Opt level: O0

unsigned_long * google::protobuf::internal::TcParser::RefAt<unsigned_long>(void *x,size_t offset)

{
  unsigned_long *puVar1;
  unsigned_long *target;
  size_t offset_local;
  void *x_local;
  
  puVar1 = (unsigned_long *)((long)x + offset);
  if (((ulong)puVar1 & 7) != 0) {
    AlignFail(puVar1);
  }
  return puVar1;
}

Assistant:

static inline const T& RefAt(const void* x, size_t offset) {
    const T* target =
        reinterpret_cast<const T*>(static_cast<const char*>(x) + offset);
#if !defined(NDEBUG) && !(defined(_MSC_VER) && defined(_M_IX86))
    // Check the alignment in debug mode, except in 32-bit msvc because it does
    // not respect the alignment as expressed by `alignof(T)`
    if (ABSL_PREDICT_FALSE(reinterpret_cast<uintptr_t>(target) % alignof(T) !=
                           0)) {
      AlignFail(std::integral_constant<size_t, alignof(T)>(),
                reinterpret_cast<uintptr_t>(target));
    }
#endif
    return *target;
  }